

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx512.cpp
# Opt level: O1

int __thiscall
ncnn::Convolution_x86_avx512::forward_int8_x86
          (Convolution_x86_avx512 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  void *pvVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [16];
  int iVar4;
  int iVar5;
  int iVar6;
  Layer *pLVar7;
  Allocator *pAVar8;
  Option OVar9;
  undefined1 auVar10 [36];
  int iVar11;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  uint uVar17;
  long lVar18;
  _func_int ***ppp_Var19;
  int *piVar20;
  int iVar21;
  uint uVar22;
  Allocator *pAVar23;
  int *piVar24;
  int m_5;
  undefined4 uVar26;
  long lVar25;
  int iVar27;
  undefined1 (*pauVar28) [64];
  int iVar29;
  int m_2;
  int iVar30;
  undefined1 (*pauVar31) [16];
  ulong uVar32;
  Option *opt_00;
  int m_6;
  int iVar33;
  int iVar34;
  undefined1 (*pauVar35) [32];
  Convolution_x86_avx512 *pCVar36;
  int m_4;
  uint uVar37;
  int *piVar38;
  undefined8 uVar39;
  undefined1 (*pauVar40) [64];
  undefined1 (*pauVar41) [32];
  undefined1 (*pauVar42) [16];
  bool bVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [32];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [32];
  undefined1 in_ZMM1 [64];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [32];
  int TILE_N;
  int TILE_K;
  int TILE_M;
  Mat m;
  Mat m_1;
  Option opt_q;
  int in_stack_fffffffffffffa00;
  uint local_5bc;
  Allocator *local_5b8;
  _func_int ***local_5b0;
  Convolution_x86_avx512 *local_5a8;
  ulong local_5a0;
  Allocator *local_598;
  ulong local_590;
  Allocator *local_588;
  void *local_580;
  _func_int ***local_578;
  ulong local_570;
  int local_564;
  Mat local_560;
  Option *local_510;
  Allocator *local_508;
  Allocator *local_500;
  uint local_4f4;
  long local_4f0;
  int local_4e8;
  int local_4e4;
  Mat local_4e0;
  undefined8 local_498;
  ulong local_490;
  ulong local_488;
  int local_47c;
  Mat *local_478;
  ulong local_470;
  Allocator *local_468;
  Mat local_460;
  Mat local_410;
  void *local_3c8;
  long local_3c0;
  int local_3b4;
  Mat local_3b0;
  undefined1 local_360 [56];
  int local_328;
  size_t local_320;
  ulong local_310;
  long local_308;
  undefined1 local_300 [20];
  int aiStack_2ec [2];
  undefined1 auStack_2e4 [4];
  Allocator *pAStack_2e0;
  int iStack_2d8;
  int iStack_2d4;
  int iStack_2d0;
  undefined8 uStack_2cc;
  undefined4 uStack_2c4;
  size_t local_2c0 [4];
  undefined1 auStack_2a0 [32];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 auStack_200 [256];
  undefined1 auStack_100 [40];
  long local_d8;
  Allocator *local_d0;
  undefined1 *local_c8;
  Mat local_c0 [2];
  
  auVar44 = in_ZMM1._0_16_;
  local_360._24_4_ = bottom_blob->elempack;
  if (local_360._24_4_ == 0) {
    bVar43 = false;
  }
  else {
    bVar43 = ((int)bottom_blob->elemsize << 3) / (int)local_360._24_4_ == 8;
  }
  piVar24 = bottom_blob->refcount;
  local_360._0_8_ = bottom_blob->data;
  local_360._8_4_ = SUB84(bottom_blob->refcount,0);
  local_360._12_4_ = (undefined4)((ulong)bottom_blob->refcount >> 0x20);
  local_360._16_8_ = bottom_blob->elemsize;
  local_360._32_8_ = bottom_blob->allocator;
  local_360._40_4_ = bottom_blob->dims;
  local_360._44_4_ = bottom_blob->w;
  local_360._48_4_ = bottom_blob->h;
  local_360._52_4_ = bottom_blob->d;
  local_328 = bottom_blob->c;
  local_320 = bottom_blob->cstep;
  if (piVar24 != (int *)0x0) {
    LOCK();
    *piVar24 = *piVar24 + 1;
    UNLOCK();
  }
  if (!bVar43) {
    auVar46 = vmovdqu64_avx512f((undefined1  [64])*opt);
    auVar46 = vmovdqa64_avx512f(auVar46);
    stack0xfffffffffffffd10 = auVar46._16_48_;
    local_300._0_8_ = auVar46._0_8_;
    local_300._8_8_ = opt->workspace_allocator;
    quantize_to_int8(bottom_blob,(Mat *)local_360,&(this->super_Convolution).bottom_blob_int8_scales
                     ,(Option *)local_300);
    if (((void *)local_360._0_8_ == (void *)0x0) || ((long)local_328 * local_320 == 0)) {
      iVar29 = -100;
      goto LAB_0018a3de;
    }
  }
  local_3b0.cstep = 0;
  local_3b0.data = (void *)0x0;
  local_3b0.refcount._0_4_ = 0;
  local_3b0.refcount._4_4_ = 0;
  local_3b0.elemsize = 0;
  local_3b0.elempack = 0;
  local_3b0.allocator = (Allocator *)0x0;
  local_3b0.dims = 0;
  local_3b0.w = 0;
  local_3b0.h = 0;
  local_3b0.d = 0;
  local_3b0.c = 0;
  Convolution::make_padding(&this->super_Convolution,(Mat *)local_360,&local_3b0,opt);
  iVar11 = local_3b0.c;
  iVar12 = local_3b0.elempack;
  if ((local_3b0.data == (void *)0x0) || ((long)local_3b0.c * local_3b0.cstep == 0)) {
LAB_0018a359:
    iVar29 = -100;
  }
  else {
    iVar30 = (~(((this->super_Convolution).kernel_w + -1) * (this->super_Convolution).dilation_w) +
             local_3b0.w) / (this->super_Convolution).stride_w + 1;
    iVar33 = (~(((this->super_Convolution).kernel_h + -1) * (this->super_Convolution).dilation_h) +
             local_3b0.h) / (this->super_Convolution).stride_h + 1;
    local_4e4 = (this->super_Convolution).int8_scale_term;
    uVar37 = 1;
    if (opt->use_packing_layout == true) {
      uVar13 = (this->super_Convolution).num_output;
      if (local_4e4 < 0x65) {
        if ((uVar13 & 0xf) == 0) {
          uVar37 = 0x10;
        }
        else if ((uVar13 & 7) == 0) {
          uVar37 = 8;
        }
        else {
          uVar37 = (uint)((uVar13 & 3) == 0) * 3 + 1;
        }
      }
      else {
        uVar37 = 1;
        if ((uVar13 & 7) == 0) {
          uVar37 = 8;
        }
      }
    }
    uVar13 = uVar37 * 4;
    if (100 < local_4e4) {
      uVar13 = uVar37;
    }
    local_5a8 = this;
    local_510 = opt;
    local_478 = top_blob;
    Mat::create(top_blob,iVar30,iVar33,(this->super_Convolution).num_output / (int)uVar37,
                (ulong)uVar13,uVar37,opt->blob_allocator);
    opt_00 = local_510;
    if (top_blob->data == (void *)0x0) goto LAB_0018a359;
    iVar29 = -100;
    if ((long)top_blob->c * top_blob->cstep != 0) {
      iVar29 = 1;
      if (local_510->use_packing_layout == true) {
        uVar37 = (local_5a8->super_Convolution).num_output;
        if (local_4e4 < 0x65) {
          if ((uVar37 & 0xf) == 0) {
            iVar29 = 0x10;
          }
          else if ((uVar37 & 7) == 0) {
            iVar29 = 8;
          }
          else {
            iVar29 = (uint)((uVar37 & 3) == 0) * 3 + 1;
          }
        }
        else {
          iVar29 = 1;
          if ((uVar37 & 7) == 0) {
            iVar29 = 8;
          }
        }
      }
      if ((local_510->use_winograd23_convolution == false) &&
         (local_510->use_winograd43_convolution != true)) {
        bVar43 = false;
      }
      else {
        bVar43 = true;
        if (iVar12 * iVar11 < 9) {
          bVar43 = 8 < (local_5a8->super_Convolution).num_output;
        }
      }
      if ((local_510->use_packing_layout != false) &&
         ((auVar51._0_4_ = (local_5a8->super_Convolution).kernel_w,
          auVar51._4_4_ = (local_5a8->super_Convolution).kernel_h,
          auVar51._8_4_ = (local_5a8->super_Convolution).dilation_w,
          auVar51._12_4_ = (local_5a8->super_Convolution).dilation_h,
          ((local_5a8->super_Convolution).stride_w == 1 & local_510->use_winograd_convolution &
           (local_5a8->super_Convolution).stride_h == 1 & auVar51 == _DAT_005f13c0 & bVar43) != 0 ||
          (local_510->use_sgemm_convolution == false)))) {
        iVar29 = (uint)(((local_5a8->super_Convolution).num_output & 3) == 0) * 3 + 1;
      }
      local_560.cstep = 0;
      local_560.data = (Allocator *)0x0;
      local_560.refcount._0_4_ = 0;
      local_560.refcount._4_4_ = 0;
      local_560.elemsize = 0;
      local_560.elempack = 0;
      local_560.allocator = (Allocator *)0x0;
      local_560.dims = 0;
      local_560.w = 0;
      local_560.h = 0;
      local_560.d = 0;
      local_560.c = 0;
      Mat::create(&local_560,iVar30,iVar33,(local_5a8->super_Convolution).num_output / iVar29,
                  (ulong)(uint)(iVar29 * 4),iVar29,local_510->workspace_allocator);
      pCVar36 = local_5a8;
      iVar29 = -100;
      if (((Allocator *)local_560.data != (Allocator *)0x0) &&
         ((long)local_560.c * local_560.cstep != 0)) {
        iVar29 = local_5a8->nT;
        uVar26 = 0;
        iVar12 = iVar29;
        if (iVar29 == 0) {
          iVar12 = opt_00->num_threads;
        }
        if (opt_00->num_threads != iVar29 && iVar29 != 0) {
          uVar26 = 0;
          forward_int8_x86();
        }
        iVar11 = (pCVar36->super_Convolution).kernel_w;
        iVar30 = (pCVar36->super_Convolution).kernel_h;
        iVar33 = (pCVar36->super_Convolution).dilation_w;
        iVar21 = (pCVar36->super_Convolution).dilation_h;
        iVar27 = (pCVar36->super_Convolution).stride_w;
        iVar34 = (pCVar36->super_Convolution).stride_h;
        if (((iVar34 == 1 && (iVar27 == 1 && iVar21 == 1)) &
            (iVar33 == 1 && iVar30 == 3) & iVar11 == 3 & bVar43 & opt_00->use_winograd_convolution)
            == 1) {
          if (((opt_00->use_winograd43_convolution == true) &&
              ((pCVar36->weight_winograd43_data).data != (void *)0x0)) &&
             ((long)(pCVar36->weight_winograd43_data).c * (pCVar36->weight_winograd43_data).cstep !=
              0)) {
            iVar29 = conv3x3s1_winograd43_int8
                               (&local_3b0,&local_560,&pCVar36->weight_winograd43_data,iVar12,opt_00
                               );
          }
          else {
            iVar29 = cpu_support_x86_avx512_vnni();
            if (iVar29 == 0) {
              iVar29 = cpu_support_x86_avx_vnni();
              if (iVar29 == 0) {
                auVar50._4_4_ = local_560.h;
                auVar50._0_4_ = local_560.w;
                auVar44 = vpcmpeqd_avx(auVar44,auVar44);
                auVar50._8_8_ = 0;
                auVar44 = vpsubd_avx(auVar50,auVar44);
                auVar51 = vpsrld_avx(auVar44,0x1f);
                auVar44 = vpaddd_avx(auVar44,auVar51);
                auVar51 = vpsrad_avx(auVar44,1);
                auVar44 = vpshufd_avx(auVar51,0x55);
                auVar44 = vpmulld_avx(auVar44,auVar51);
                local_310 = (ulong)(uint)(local_560.elempack * local_560.c);
                local_498 = CONCAT44(uVar26,auVar44._0_4_);
                uVar37 = local_3b0.elempack * local_3b0.c;
                uVar32 = (ulong)uVar37;
                get_optimal_tile_mnk_int8
                          (local_560.elempack * local_560.c,auVar44._0_4_,uVar37,(int *)&local_4f4,
                           (int *)&local_5bc,&local_564,iVar12);
                local_47c = (int)((int)local_310 + local_4f4 + -1) / (int)local_4f4;
                iVar30 = (int)((int)local_498 + local_5bc + -1) / (int)local_5bc;
                iVar11 = (int)(uVar37 + local_564 + -1) / local_564;
                iVar33 = local_564 * local_5bc;
                local_410.cstep = 0;
                local_410.data = (void *)0x0;
                local_410.refcount._0_4_ = 0;
                local_410.refcount._4_4_ = 0;
                local_410.elemsize = 0;
                local_410.elempack = 0;
                local_410.allocator = (Allocator *)0x0;
                local_410.dims = 0;
                local_410.w = 0;
                local_410.h = 0;
                local_410.d = 0;
                local_410.c = 0;
                Mat::create(&local_410,iVar33,0x10,iVar11,iVar30,2,opt_00->workspace_allocator);
                iVar29 = -100;
                local_490 = uVar32;
                if ((local_410.data != (void *)0x0) && ((long)local_410.c * local_410.cstep != 0)) {
                  iVar30 = iVar30 * iVar11;
                  iVar33 = iVar33 * 0x10;
                  uVar26 = uStack_2c4;
                  if ((iVar12 < 2) || (iVar12 <= iVar30)) {
                    local_2c0[0] = 0;
                    _local_300 = ZEXT1228((undefined1  [12])0x0);
                    _local_300 = ZEXT3260(_local_300);
                    _local_300 = (Option)CONCAT460(uVar26,_local_300);
                    Mat::create((Mat *)local_300,iVar33,1,iVar12,2,opt_00->workspace_allocator);
                    auVar10 = _auStack_2e4;
                    if ((void *)local_300._0_8_ == (void *)0x0) {
                      bVar43 = true;
                    }
                    else {
                      bVar43 = (long)(int)uStack_2cc._4_4_ * local_2c0[0] == 0;
                    }
                    if (bVar43) {
                      _auStack_2e4 = auVar10;
                      if ((Allocator *)local_300._8_8_ != (Allocator *)0x0) {
                        LOCK();
                        *(int *)(_func_int ***)local_300._8_8_ =
                             *(int *)(_func_int ***)local_300._8_8_ + -1;
                        UNLOCK();
                        if (*(int *)(_func_int ***)local_300._8_8_ == 0) {
                          if (pAStack_2e0 == (Allocator *)0x0) {
                            if ((void *)local_300._0_8_ != (void *)0x0) {
                              free((void *)local_300._0_8_);
                            }
                          }
                          else {
                            (*pAStack_2e0->_vptr_Allocator[3])();
                          }
                        }
                      }
                      auVar10 = _auStack_2e4;
                      local_2c0[0] = 0;
                      local_300._0_12_ = SUB1612((undefined1  [16])0x0,0);
                      _local_300 = ZEXT1228(local_300._0_12_);
                      uStack_2c4 = auVar10._32_4_;
                      _local_300 = ZEXT4060(_local_300);
                    }
                    else {
                      local_578 = (_func_int ***)((ulong)local_578 & 0xffffffffffffff00);
                      if (0 < iVar30) {
                        iVar33 = 0;
                        do {
                          local_5b8 = (Allocator *)CONCAT44(local_5b8._4_4_,iVar33 / iVar11);
                          iVar21 = local_5bc * (iVar33 / iVar11);
                          local_5b0 = (_func_int ***)CONCAT44(local_5b0._4_4_,iVar33 % iVar11);
                          iVar27 = local_564 * (iVar33 % iVar11);
                          local_570 = CONCAT44(local_570._4_4_,iVar21);
                          uVar37 = (int)local_498 - iVar21;
                          if ((int)local_5bc < (int)uVar37) {
                            uVar37 = local_5bc;
                          }
                          iVar21 = (int)local_490 - iVar27;
                          if (local_564 < iVar21) {
                            iVar21 = local_564;
                          }
                          iVar34 = get_omp_thread_num();
                          local_4e0.data =
                               (void *)((long)iVar34 * local_2c0[0] * (long)stack0xfffffffffffffd10
                                       + local_300._0_8_);
                          local_4e0.refcount._0_4_ = 0;
                          local_4e0.refcount._4_4_ = 0;
                          local_4e0.elemsize = (size_t)stack0xfffffffffffffd10;
                          local_4e0.elempack = aiStack_2ec[1];
                          local_4e0.allocator = pAStack_2e0;
                          local_4e0.w = iStack_2d4;
                          local_4e0.h = iStack_2d0;
                          local_4e0.d = 1;
                          local_4e0.c = (int)uStack_2cc;
                          local_4e0.dims = iStack_2d8 + -1;
                          local_4e0.cstep =
                               ((long)stack0xfffffffffffffd10 * (long)iStack_2d0 * (long)iStack_2d4
                                + 0xfU & 0xfffffffffffffff0) / (ulong)stack0xfffffffffffffd10;
                          if (iStack_2d8 == 4) {
                            local_4e0.cstep = (long)iStack_2d0 * (long)iStack_2d4;
                          }
                          conv3x3s1_winograd23_transform_input_tile_int8
                                    (&local_3b0,&local_4e0,(int)local_570,uVar37,iVar27,iVar21,
                                     in_stack_fffffffffffffa00);
                          local_460.cstep = (long)local_410.h * (long)local_410.w;
                          local_460.data =
                               (void *)((long)local_410.data +
                                       ((ulong)local_5b0 & 0xffffffff) * local_410.elemsize *
                                       local_460.cstep +
                                       (long)(int)local_5b8 * local_410.cstep * local_410.elemsize);
                          local_460.refcount._0_4_ = 0;
                          local_460.refcount._4_4_ = 0;
                          local_460.elemsize._0_4_ = (undefined4)local_410.elemsize;
                          local_460.elemsize._4_4_ = (undefined4)(local_410.elemsize >> 0x20);
                          local_460.elempack = local_410.elempack;
                          local_460.allocator = local_410.allocator;
                          local_460.dims = 2;
                          local_460.w = local_410.w;
                          local_460.h = local_410.h;
                          local_460.d = 1;
                          local_460.c = 1;
                          transpose_pack_B_tile_int8
                                    (&local_4e0,&local_460,0x10,uVar37,iVar21,(int)local_460.cstep);
                          opt_00 = local_510;
                          pCVar36 = local_5a8;
                          local_460.cstep = 0;
                          local_460.data = (void *)0x0;
                          local_460.refcount._0_4_ = 0;
                          local_460.refcount._4_4_ = 0;
                          local_460.elemsize._0_4_ = 0;
                          local_460.elemsize._4_4_ = 0;
                          local_460.elempack = 0;
                          local_460.dims = 0;
                          local_460.w = 0;
                          local_460.h = 0;
                          local_460.d = 0;
                          local_460.c = 0;
                          piVar24 = (int *)CONCAT44(local_4e0.refcount._4_4_,
                                                    local_4e0.refcount._0_4_);
                          if (piVar24 != (int *)0x0) {
                            LOCK();
                            *piVar24 = *piVar24 + -1;
                            UNLOCK();
                            if (*piVar24 == 0) {
                              if (local_4e0.allocator == (Allocator *)0x0) {
                                if (local_4e0.data != (void *)0x0) {
                                  free(local_4e0.data);
                                }
                              }
                              else {
                                (*(local_4e0.allocator)->_vptr_Allocator[3])();
                              }
                            }
                          }
                          local_4e0.cstep = 0;
                          local_4e0.data = (void *)0x0;
                          local_4e0.refcount._0_4_ = 0;
                          local_4e0.refcount._4_4_ = 0;
                          local_4e0.elemsize = 0;
                          local_4e0.elempack = 0;
                          local_4e0.dims = 0;
                          local_4e0.w = 0;
                          local_4e0.h = 0;
                          local_4e0.d = 0;
                          local_4e0.c = 0;
                          iVar33 = iVar33 + 1;
                        } while (iVar30 != iVar33);
                      }
                      if ((Allocator *)local_300._8_8_ != (Allocator *)0x0) {
                        LOCK();
                        *(int *)(_func_int ***)local_300._8_8_ =
                             *(int *)(_func_int ***)local_300._8_8_ + -1;
                        UNLOCK();
                        if (*(int *)(_func_int ***)local_300._8_8_ == 0) {
                          if (pAStack_2e0 == (Allocator *)0x0) {
                            if ((void *)local_300._0_8_ != (void *)0x0) {
                              free((void *)local_300._0_8_);
                            }
                          }
                          else {
                            (*pAStack_2e0->_vptr_Allocator[3])();
                          }
                        }
                      }
                      auVar10 = _auStack_2e4;
                      local_2c0[0] = 0;
                      local_300._0_12_ = SUB1612((undefined1  [16])0x0,0);
                      _local_300 = ZEXT1228(local_300._0_12_);
                      uStack_2c4 = auVar10._32_4_;
                      _local_300 = ZEXT4060(_local_300);
                      if ((char)local_578 == '\0') goto LAB_0018b761;
                    }
                  }
                  else {
                    local_2c0[0] = 0;
                    _local_300 = ZEXT1228((undefined1  [12])0x0);
                    _local_300 = ZEXT3260(_local_300);
                    _local_300 = (Option)CONCAT460(uVar26,_local_300);
                    Mat::create((Mat *)local_300,iVar33,2,opt_00->workspace_allocator);
                    auVar10 = _auStack_2e4;
                    if ((void *)local_300._0_8_ == (void *)0x0) {
                      bVar43 = true;
                    }
                    else {
                      bVar43 = (long)(int)uStack_2cc._4_4_ * local_2c0[0] == 0;
                    }
                    piVar24 = &iStack_2d8;
                    if (bVar43) {
                      _auStack_2e4 = auVar10;
                      if ((Allocator *)local_300._8_8_ != (Allocator *)0x0) {
                        LOCK();
                        *(int *)(_func_int ***)local_300._8_8_ =
                             *(int *)(_func_int ***)local_300._8_8_ + -1;
                        UNLOCK();
                        if (*(int *)(_func_int ***)local_300._8_8_ == 0) {
                          if (pAStack_2e0 == (Allocator *)0x0) {
                            if ((void *)local_300._0_8_ != (void *)0x0) {
                              free((void *)local_300._0_8_);
                            }
                          }
                          else {
                            (*pAStack_2e0->_vptr_Allocator[3])();
                          }
                        }
                      }
                      local_2c0[0] = 0;
                      local_300._0_12_ = SUB1612((undefined1  [16])0x0,0);
                      _local_300 = ZEXT1228(local_300._0_12_);
                      iVar29 = -100;
                    }
                    else {
                      local_570 = local_570 & 0xffffffffffffff00;
                      if (0 < iVar30) {
                        local_5b0 = (_func_int ***)CONCAT44(local_5b0._4_4_,local_5bc);
                        local_5b8 = (Allocator *)CONCAT44(local_5b8._4_4_,local_564);
                        iVar29 = 0;
                        do {
                          iVar21 = (int)local_5b0 * (iVar29 / iVar11);
                          iVar27 = (int)local_5b8 * (int)((long)iVar29 % (long)iVar11);
                          iVar33 = (int)local_498 - iVar21;
                          if ((int)local_5b0 < iVar33) {
                            iVar33 = (int)local_5b0;
                          }
                          iVar34 = (int)local_490 - iVar27;
                          if ((int)local_5b8 < iVar34) {
                            iVar34 = (int)local_5b8;
                          }
                          conv3x3s1_winograd23_transform_input_tile_int8
                                    (&local_3b0,(Mat *)local_300,iVar21,iVar33,iVar27,iVar34,
                                     in_stack_fffffffffffffa00);
                          local_4e0.cstep = (long)local_410.h * (long)local_410.w;
                          local_4e0.data =
                               (void *)((long)local_410.data +
                                       ((long)iVar29 % (long)iVar11 & 0xffffffffU) *
                                       local_410.elemsize * local_4e0.cstep +
                                       (long)(iVar29 / iVar11) * local_410.cstep *
                                       local_410.elemsize);
                          local_4e0.refcount._0_4_ = 0;
                          local_4e0.refcount._4_4_ = 0;
                          local_4e0.elemsize = local_410.elemsize;
                          local_4e0.elempack = local_410.elempack;
                          local_4e0.allocator = local_410.allocator;
                          local_4e0.dims = 2;
                          local_4e0.w = local_410.w;
                          local_4e0.h = local_410.h;
                          local_4e0.d = 1;
                          local_4e0.c = 1;
                          transpose_pack_B_tile_int8
                                    ((Mat *)local_300,&local_4e0,0x10,iVar33,iVar34,
                                     (int)local_4e0.cstep);
                          local_4e0.cstep = 0;
                          local_4e0.data = (void *)0x0;
                          local_4e0.refcount._0_4_ = 0;
                          local_4e0.refcount._4_4_ = 0;
                          local_4e0.elemsize = 0;
                          local_4e0.elempack = 0;
                          local_4e0.dims = 0;
                          local_4e0.w = 0;
                          local_4e0.h = 0;
                          local_4e0.d = 0;
                          local_4e0.c = 0;
                          iVar29 = iVar29 + 1;
                        } while (iVar30 != iVar29);
                      }
                      opt_00 = local_510;
                      pCVar36 = local_5a8;
                      iVar29 = -100;
                      if ((Allocator *)local_300._8_8_ != (Allocator *)0x0) {
                        LOCK();
                        *(int *)(_func_int ***)local_300._8_8_ =
                             *(int *)(_func_int ***)local_300._8_8_ + -1;
                        UNLOCK();
                        if (*(int *)(_func_int ***)local_300._8_8_ == 0) {
                          if (pAStack_2e0 == (Allocator *)0x0) {
                            if ((void *)local_300._0_8_ != (void *)0x0) {
                              free((void *)local_300._0_8_);
                            }
                          }
                          else {
                            (*pAStack_2e0->_vptr_Allocator[3])();
                          }
                        }
                      }
                      auVar10 = _auStack_2e4;
                      local_2c0[0] = 0;
                      local_300._0_12_ = SUB1612((undefined1  [16])0x0,0);
                      _local_300 = ZEXT1228(local_300._0_12_);
                      uStack_2c4 = auVar10._32_4_;
                      _local_300 = ZEXT4060(_local_300);
                      if ((char)local_570 != '\0') goto LAB_0018cb52;
LAB_0018b761:
                      local_2c0[0] = 0;
                      local_4e0.cstep = 0;
                      local_4e0.data = (void *)0x0;
                      local_4e0.refcount._0_4_ = 0;
                      local_4e0.refcount._4_4_ = 0;
                      local_4e0.elemsize = 0;
                      local_4e0.elempack = 0;
                      local_4e0.allocator = (Allocator *)0x0;
                      local_4e0.dims = 0;
                      local_4e0.w = 0;
                      local_4e0.h = 0;
                      local_4e0.d = 0;
                      local_4e0.c = 0;
                      Mat::create(&local_4e0,local_5bc * local_4f4 * 0x10,1,iVar12,4,
                                  opt_00->workspace_allocator);
                      iVar29 = -100;
                      if ((local_4e0.data != (void *)0x0) &&
                         ((long)local_4e0.c * local_4e0.cstep != 0)) {
                        if (local_47c < 1) {
                          iVar29 = 0;
                        }
                        else {
                          iVar29 = 0;
                          uVar32 = local_490;
                          uVar39 = local_498;
                          do {
                            uVar37 = local_4f4;
                            iVar12 = get_omp_thread_num();
                            local_460.data =
                                 (void *)((long)iVar12 * local_4e0.cstep * local_4e0.elemsize +
                                         (long)local_4e0.data);
                            local_460.refcount._0_4_ = 0;
                            local_460.refcount._4_4_ = 0;
                            local_460.elemsize._0_4_ = (undefined4)local_4e0.elemsize;
                            local_460.elemsize._4_4_ = (undefined4)(local_4e0.elemsize >> 0x20);
                            local_460.elempack = local_4e0.elempack;
                            local_460.allocator = local_4e0.allocator;
                            local_460.w = local_4e0.w;
                            local_460.h = local_4e0.h;
                            local_460.d = 1;
                            local_460.c = local_4e0.d;
                            local_460.dims = local_4e0.dims + -1;
                            local_460.cstep =
                                 (local_4e0.elemsize * (long)local_4e0.h * (long)local_4e0.w + 0xf &
                                 0xfffffffffffffff0) / local_4e0.elemsize;
                            if (local_4e0.dims == 4) {
                              local_460.cstep = (long)local_4e0.h * (long)local_4e0.w;
                            }
                            uVar17 = uVar37 * iVar29;
                            local_488 = (ulong)uVar17;
                            uVar13 = (int)local_310 - uVar17;
                            if ((int)uVar37 < (int)uVar13) {
                              uVar13 = uVar37;
                            }
                            local_3b4 = iVar29;
                            if (0 < (int)uVar39) {
                              local_c8 = (undefined1 *)(ulong)uVar13;
                              local_468 = (Allocator *)(long)(int)uVar13;
                              local_308 = (long)(int)uVar17;
                              uVar14 = 0;
                              do {
                                uVar37 = (int)uVar39 - (int)uVar14;
                                if ((int)local_5bc < (int)uVar37) {
                                  uVar37 = local_5bc;
                                }
                                local_590 = (ulong)uVar37;
                                local_570 = uVar14;
                                if (0 < (int)uVar32) {
                                  iVar29 = 0;
                                  do {
                                    OVar9 = _local_300;
                                    uVar14 = local_490;
                                    iVar12 = (int)uVar32 - iVar29;
                                    if (local_564 < iVar12) {
                                      iVar12 = local_564;
                                    }
                                    iVar11 = (pCVar36->weight_winograd23_data).w;
                                    unique0x00012000 =
                                         (Allocator *)(pCVar36->weight_winograd23_data).elemsize;
                                    iVar30 = (pCVar36->weight_winograd23_data).h;
                                    local_2c0[0] = (long)iVar30 * (long)iVar11;
                                    local_300._8_8_ = 0;
                                    local_300._0_8_ =
                                         (long)(pCVar36->weight_winograd23_data).data +
                                         (long)unique0x00012000 * local_2c0[0] *
                                         (long)(iVar29 / local_564) +
                                         (long)(int)((long)((ulong)(uint)((int)local_488 >> 0x1f) <<
                                                            0x20 | local_488 & 0xffffffff) /
                                                    (long)(int)local_4f4) *
                                         (pCVar36->weight_winograd23_data).cstep *
                                         (long)unique0x00012000;
                                    _auStack_2e4 = OVar9._28_36_;
                                    aiStack_2ec[1] = (pCVar36->weight_winograd23_data).elempack;
                                    pAStack_2e0 = (pCVar36->weight_winograd23_data).allocator;
                                    iStack_2d8 = 2;
                                    iStack_2d4._0_1_ = (bool)(char)iVar11;
                                    iStack_2d4._1_1_ = (bool)(char)((uint)iVar11 >> 8);
                                    iStack_2d4._2_1_ = (bool)(char)((uint)iVar11 >> 0x10);
                                    iStack_2d4._3_1_ = (bool)(char)((uint)iVar11 >> 0x18);
                                    iStack_2d0 = iVar30;
                                    uStack_2c4 = OVar9._60_4_;
                                    uStack_2cc._0_1_ = true;
                                    uStack_2cc._1_1_ = false;
                                    uStack_2cc._2_1_ = false;
                                    uStack_2cc._3_1_ = false;
                                    uStack_2cc._4_1_ = true;
                                    uStack_2cc._5_1_ = false;
                                    uStack_2cc._6_1_ = false;
                                    uStack_2cc._7_1_ = false;
                                    local_c0[0].cstep = (long)local_410.h * (long)local_410.w;
                                    local_c0[0].data =
                                         (void *)((long)local_410.data +
                                                 local_c0[0].cstep * local_410.elemsize *
                                                 (long)(iVar29 / local_564) +
                                                 (long)(int)((long)((ulong)(uint)((int)local_570 >>
                                                                                 0x1f) << 0x20 |
                                                                   local_570 & 0xffffffff) /
                                                            (long)(int)local_5bc) * local_410.cstep
                                                 * local_410.elemsize);
                                    local_c0[0].refcount._0_4_ = 0;
                                    local_c0[0].refcount._4_4_ = 0;
                                    local_c0[0].elemsize._0_4_ = (undefined4)local_410.elemsize;
                                    local_c0[0].elemsize._4_4_ =
                                         (undefined4)(local_410.elemsize >> 0x20);
                                    local_c0[0].elempack = local_410.elempack;
                                    local_c0[0].allocator = local_410.allocator;
                                    local_c0[0].w = local_410.w;
                                    local_c0[0].dims = 2;
                                    local_c0[0].h = local_410.h;
                                    local_c0[0].d = 1;
                                    local_c0[0].c = 1;
                                    iVar11 = (int)local_490;
                                    gemm_transB_packed_tile_int8
                                              ((Mat *)local_300,local_c0,&local_460,0x10,uVar13,
                                               (int)local_590,iVar29,iVar12,
                                               iVar11 <= local_564 + iVar29);
                                    local_c0[0].cstep = 0;
                                    local_c0[0].data = (void *)0x0;
                                    local_c0[0].refcount._0_4_ = 0;
                                    local_c0[0].refcount._4_4_ = 0;
                                    local_c0[0].elemsize._0_4_ = 0;
                                    local_c0[0].elemsize._4_4_ = 0;
                                    local_c0[0].elempack = 0;
                                    local_c0[0].dims = 0;
                                    local_c0[0].w = 0;
                                    local_c0[0].h = 0;
                                    local_c0[0].d = 0;
                                    local_c0[0].c = 0;
                                    if ((Allocator *)local_300._8_8_ != (Allocator *)0x0) {
                                      LOCK();
                                      *(int *)(_func_int ***)local_300._8_8_ =
                                           *(int *)(_func_int ***)local_300._8_8_ + -1;
                                      UNLOCK();
                                      if (*(int *)(_func_int ***)local_300._8_8_ == 0) {
                                        if (pAStack_2e0 == (Allocator *)0x0) {
                                          if ((void *)local_300._0_8_ != (void *)0x0) {
                                            free((void *)local_300._0_8_);
                                          }
                                        }
                                        else {
                                          (*pAStack_2e0->_vptr_Allocator[3])();
                                        }
                                      }
                                    }
                                    auVar10 = _auStack_2e4;
                                    local_2c0[0] = 0;
                                    local_300._0_16_ = ZEXT816(0);
                                    _local_300 = ZEXT1228(local_300._0_12_);
                                    uStack_2c4 = auVar10._32_4_;
                                    _local_300 = ZEXT4060(_local_300);
                                    iVar29 = iVar29 + local_564;
                                    uVar32 = uVar14;
                                    pCVar36 = local_5a8;
                                  } while (iVar29 < iVar11);
                                }
                                local_4e8 = (int)local_560.cstep * local_560.elempack;
                                iVar29 = (local_560.w - (local_560.w + 1 >> 0x1f)) + 1 >> 1;
                                iVar12 = (int)local_590;
                                uVar37 = iVar12 * 0x10;
                                local_470 = (ulong)uVar37;
                                pAVar23 = (Allocator *)0x0;
                                iVar11 = (int)local_488;
                                iVar30 = (int)local_570;
                                if (0xf < (int)uVar13) {
                                  lVar25 = (long)local_4e8;
                                  local_5b0 = (_func_int ***)(long)(local_4e8 * 2);
                                  local_5b8 = (Allocator *)(long)(local_4e8 * 3);
                                  auVar46 = vpbroadcastd_avx512f();
                                  auVar46 = vpmulld_avx512f(auVar46,_DAT_005f1bc0);
                                  local_500 = (Allocator *)(local_590 & 0xffffffff);
                                  local_5a0 = CONCAT44(local_5a0._4_4_,iVar12 * 0x100);
                                  local_4f0 = (long)(int)uVar37 * 4;
                                  local_3c0 = (long)(iVar12 << 5) * 4;
                                  local_3c8 = (void *)((long)(iVar12 * 0x30) * 4);
                                  local_588 = (Allocator *)0x0;
                                  local_508 = (Allocator *)0x0;
                                  do {
                                    if (0 < iVar12) {
                                      lVar15 = (long)(int)local_588;
                                      local_580 = (void *)(long)((iVar11 + (int)local_508) /
                                                                local_560.elempack);
                                      ppp_Var19 = (_func_int ***)0x0;
                                      pAVar23 = (Allocator *)0x0;
                                      do {
                                        local_598 = pAVar23;
                                        local_578 = ppp_Var19;
                                        lVar16 = (long)local_460.data + (long)local_578;
                                        lVar18 = -0x100;
                                        do {
                                          auVar47 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                                       (lVar16 + local_4f0 +
                                                                                 lVar15 * 4));
                                          auVar48 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                                       (lVar16 + local_3c0 +
                                                                                 lVar15 * 4));
                                          auVar49 = vpaddd_avx512f(auVar47,*(undefined1 (*) [64])
                                                                            (lVar16 + lVar15 * 4));
                                          auVar49 = vpaddd_avx512f(auVar49,auVar48);
                                          auVar47 = vpsubd_avx512f(auVar47,auVar48);
                                          auVar48 = vpaddd_avx512f(auVar47,*(undefined1 (*) [64])
                                                                            ((long)local_3c8 +
                                                                            lVar16 + lVar15 * 4));
                                          auVar47 = vmovdqa64_avx512f(auVar49);
                                          *(undefined1 (*) [64])(auStack_200 + lVar18) = auVar47;
                                          auVar47 = vmovdqa64_avx512f(auVar48);
                                          *(undefined1 (*) [64])(auStack_100 + lVar18) = auVar47;
                                          lVar16 = lVar16 + (long)(iVar12 << 6) * 4;
                                          lVar18 = lVar18 + 0x40;
                                        } while (lVar18 != 0);
                                        iVar21 = iVar30 + (int)local_598;
                                        iVar33 = iVar21 % iVar29;
                                        uVar17 = (iVar21 / iVar29) * 2;
                                        pauVar28 = (undefined1 (*) [64])
                                                   ((long)(_func_int ***)local_560.data +
                                                   (long)(iVar33 * 2 * local_560.elempack) * 4 +
                                                   (long)local_560.w * local_560.elemsize *
                                                   (long)(int)uVar17 +
                                                   local_560.cstep * (long)local_580 *
                                                   local_560.elemsize);
                                        iVar33 = iVar33 * 2 + 1;
                                        pauVar40 = &local_240;
                                        lVar16 = 0;
                                        do {
                                          if ((int)(uVar17 | (uint)lVar16) < local_560.h) {
                                            auVar47 = vmovdqa64_avx512f(pauVar40[-2]);
                                            auVar48 = vpaddd_avx512f(auVar47,pauVar40[-3]);
                                            auVar49 = vmovdqa64_avx512f(pauVar40[-1]);
                                            auVar47 = vpsubd_avx512f(auVar47,auVar49);
                                            auVar47 = vpaddd_avx512f(auVar47,*pauVar40);
                                            auVar48 = vpaddd_avx512f(auVar48,auVar49);
                                            auVar48 = vpsrad_avx512f(auVar48,2);
                                            auVar47 = vpsrad_avx512f(auVar47,2);
                                            if (local_560.elempack < 8) {
LAB_0018be8d:
                                              if (local_560.elempack == 1) {
                                                vpscatterdd_avx512f(ZEXT864(pauVar28) +
                                                                    auVar46 * (undefined1  [64])0x4,
                                                                    0xffff,auVar48);
                                                if (iVar33 < local_560.w) {
                                                  vpscatterdd_avx512f(ZEXT864(pauVar28) + ZEXT864(4)
                                                                      + auVar46 * (undefined1  [64])
                                                                                  0x4,0xffff,auVar47
                                                                     );
                                                }
                                              }
                                              else if (local_560.elempack == 4) {
                                                *(undefined1 (*) [16])*pauVar28 = auVar48._0_16_;
                                                auVar44 = vextracti32x4_avx512f(auVar48,1);
                                                *(undefined1 (*) [16])(*pauVar28 + lVar25 * 4) =
                                                     auVar44;
                                                auVar44 = vextracti32x4_avx512f(auVar48,2);
                                                *(undefined1 (*) [16])
                                                 (*pauVar28 + (long)local_5b0 * 4) = auVar44;
                                                auVar44 = vextracti32x4_avx512f(auVar48,3);
                                                *(undefined1 (*) [16])
                                                 (*pauVar28 + (long)local_5b8 * 4) = auVar44;
                                                if (iVar33 < local_560.w) {
                                                  *(undefined1 (*) [16])(*pauVar28 + 0x10) =
                                                       auVar47._0_16_;
                                                  auVar44 = vextracti32x4_avx512f(auVar47,1);
                                                  *(undefined1 (*) [16])(*pauVar28 + lVar25 * 4 + 8)
                                                       = auVar44;
                                                  auVar44 = vextracti32x4_avx512f(auVar47,2);
                                                  *(undefined1 (*) [16])
                                                   (*pauVar28 + (long)local_5b0 * 4 + 8) = auVar44;
                                                  auVar44 = vextracti32x4_avx512f(auVar47,3);
                                                  *(undefined1 (*) [16])
                                                   (*pauVar28 + (long)local_5b8 * 4 + 8) = auVar44;
                                                }
                                              }
                                            }
                                            else {
                                              if (local_560.elempack == 8) {
                                                *(undefined1 (*) [32])*pauVar28 = auVar48._0_32_;
                                                auVar45 = vextracti64x4_avx512f(auVar48,1);
                                                *(undefined1 (*) [32])(*pauVar28 + lVar25 * 4) =
                                                     auVar45;
                                                if (iVar33 < local_560.w) {
                                                  *(undefined1 (*) [32])(*pauVar28 + 0x20) =
                                                       auVar47._0_32_;
                                                  auVar45 = vextracti64x4_avx512f(auVar47,1);
                                                  *(undefined1 (*) [32])
                                                   (*pauVar28 + lVar25 * 4 + 0x10) = auVar45;
                                                }
                                                goto LAB_0018be8d;
                                              }
                                              if (local_560.elempack == 0x10) {
                                                auVar48 = vmovdqa64_avx512f(auVar48);
                                                *pauVar28 = auVar48;
                                                if (iVar33 < local_560.w) {
                                                  auVar47 = vmovdqa64_avx512f(auVar47);
                                                  pauVar28[1] = auVar47;
                                                }
                                              }
                                            }
                                            pauVar28 = (undefined1 (*) [64])
                                                       (*pauVar28 +
                                                       (long)(local_560.elempack * local_560.w) * 4)
                                            ;
                                          }
                                          lVar16 = lVar16 + 1;
                                          pauVar40 = pauVar40 + 4;
                                        } while (lVar16 == 1);
                                        pAVar23 = (Allocator *)
                                                  ((long)&local_598->_vptr_Allocator + 1);
                                        ppp_Var19 = local_578 + 8;
                                      } while (pAVar23 != local_500);
                                    }
                                    pAVar23 = local_508 + 2;
                                    pAVar8 = local_508 + 3;
                                    local_588 = (Allocator *)
                                                (ulong)(uint)((int)local_588 + iVar12 * 0x100);
                                    local_508 = pAVar23;
                                  } while ((undefined1 *)((long)&pAVar8->_vptr_Allocator + 7U) <
                                           local_c8);
                                }
                                uVar17 = (uint)pAVar23;
                                if ((int)(uVar17 | 7) < (int)uVar13) {
                                  auVar45 = vpbroadcastd_avx512vl();
                                  auVar45 = vpmulld_avx2(auVar45,_DAT_005f2f00);
                                  local_598 = (Allocator *)(local_590 & 0xffffffff);
                                  uVar22 = uVar17 * iVar12 * 0x10;
                                  local_500 = (Allocator *)CONCAT44(local_500._4_4_,iVar12 * 0x80);
                                  local_588 = (Allocator *)((long)(iVar12 * 8) * 4);
                                  local_508 = (Allocator *)((long)(int)uVar37 * 4);
                                  local_4f0 = (long)(iVar12 * 0x18) * 4;
                                  local_580 = (void *)(long)(int)uVar17;
                                  do {
                                    local_5a0 = (ulong)uVar22;
                                    if (0 < iVar12) {
                                      lVar25 = (long)(int)uVar22;
                                      local_578 = (_func_int ***)
                                                  (long)((iVar11 + (int)local_580) /
                                                        local_560.elempack);
                                      ppp_Var19 = (_func_int ***)0x0;
                                      pAVar23 = (Allocator *)0x0;
                                      do {
                                        local_5b8 = pAVar23;
                                        local_5b0 = ppp_Var19;
                                        lVar15 = (long)local_460.data + (long)local_5b0;
                                        lVar16 = -0x80;
                                        do {
                                          auVar54 = *(undefined1 (*) [32])
                                                     ((long)&local_588->_vptr_Allocator +
                                                     lVar15 + lVar25 * 4);
                                          auVar2 = *(undefined1 (*) [32])
                                                    ((long)&local_508->_vptr_Allocator +
                                                    lVar15 + lVar25 * 4);
                                          auVar57 = vpaddd_avx2(auVar54,*(undefined1 (*) [32])
                                                                         (lVar15 + lVar25 * 4));
                                          auVar57 = vpaddd_avx2(auVar57,auVar2);
                                          auVar54 = vpsubd_avx2(auVar54,auVar2);
                                          auVar54 = vpaddd_avx2(auVar54,*(undefined1 (*) [32])
                                                                         (lVar15 + local_4f0 +
                                                                                   lVar25 * 4));
                                          *(undefined1 (*) [32])(local_280 + lVar16) = auVar57;
                                          *(undefined1 (*) [32])(auStack_200 + lVar16) = auVar54;
                                          lVar15 = lVar15 + (long)(iVar12 << 5) * 4;
                                          lVar16 = lVar16 + 0x20;
                                        } while (lVar16 != 0);
                                        iVar21 = iVar30 + (int)local_5b8;
                                        iVar33 = iVar21 % iVar29;
                                        uVar17 = (iVar21 / iVar29) * 2;
                                        pauVar41 = (undefined1 (*) [32])
                                                   ((long)(_func_int ***)local_560.data +
                                                   (long)(iVar33 * 2 * local_560.elempack) * 4 +
                                                   (long)local_560.w * local_560.elemsize *
                                                   (long)(int)uVar17 +
                                                   local_560.cstep * (long)local_578 *
                                                   local_560.elemsize);
                                        iVar33 = iVar33 * 2 + 1;
                                        pauVar35 = &auStack_2a0;
                                        lVar15 = 0;
                                        do {
                                          if ((int)(uVar17 | (uint)lVar15) < local_560.h) {
                                            auVar54 = vpaddd_avx2(pauVar35[-2],pauVar35[-3]);
                                            auVar2 = vpsubd_avx2(pauVar35[-2],pauVar35[-1]);
                                            auVar2 = vpaddd_avx2(auVar2,*pauVar35);
                                            auVar54 = vpaddd_avx2(auVar54,pauVar35[-1]);
                                            auVar57 = vpsrad_avx2(auVar54,2);
                                            auVar54 = vpsrad_avx2(auVar2,2);
                                            if (local_560.elempack == 1) {
                                              vpscatterdd_avx512vl
                                                        (ZEXT832(pauVar41) +
                                                         auVar45 * (undefined1  [32])0x4,0xffff,
                                                         auVar57);
                                              if (iVar33 < local_560.w) {
                                                vpscatterdd_avx512vl
                                                          (ZEXT832(pauVar41) + ZEXT832(4) +
                                                           auVar45 * (undefined1  [32])0x4,0xffff,
                                                           auVar54);
                                              }
                                            }
                                            else if (local_560.elempack == 4) {
                                              *(undefined1 (*) [16])*pauVar41 = auVar57._0_16_;
                                              *(undefined1 (*) [16])
                                               (*pauVar41 + (long)local_4e8 * 4) = auVar57._16_16_;
                                              if (iVar33 < local_560.w) {
                                                *(undefined1 (*) [16])(*pauVar41 + 0x10) =
                                                     auVar54._0_16_;
                                                *(undefined1 (*) [16])
                                                 (*pauVar41 + (long)local_4e8 * 4 + 0x10) =
                                                     auVar54._16_16_;
                                              }
                                            }
                                            else if ((local_560.elempack == 8) &&
                                                    (*pauVar41 = auVar57, iVar33 < local_560.w)) {
                                              pauVar41[1] = auVar54;
                                            }
                                            pauVar41 = (undefined1 (*) [32])
                                                       (*pauVar41 +
                                                       (long)(local_560.elempack * local_560.w) * 4)
                                            ;
                                          }
                                          lVar15 = lVar15 + 1;
                                          pauVar35 = pauVar35 + 4;
                                        } while (lVar15 == 1);
                                        pAVar23 = (Allocator *)
                                                  ((long)&local_5b8->_vptr_Allocator + 1);
                                        ppp_Var19 = local_5b0 + 4;
                                      } while (pAVar23 != local_598);
                                    }
                                    pvVar1 = (void *)((long)local_580 + 8);
                                    lVar25 = (long)local_580 + 0xf;
                                    uVar22 = uVar22 + iVar12 * 0x80;
                                    local_580 = pvVar1;
                                  } while (lVar25 < (long)local_468);
                                  uVar17 = (uint)pvVar1;
                                }
                                if ((int)(uVar17 | 3) < (int)uVar13) {
                                  auVar44 = vpbroadcastd_avx512vl();
                                  auVar44 = vpmulld_avx(auVar44,_DAT_005f14d0);
                                  local_578 = (_func_int ***)(local_590 & 0xffffffff);
                                  local_508 = (Allocator *)((long)(iVar12 * 0xc) * 4);
                                  uVar22 = uVar17 * iVar12 * 0x10;
                                  local_580 = (void *)CONCAT44(local_580._4_4_,iVar12 * 0x40);
                                  local_588 = (Allocator *)((long)(iVar12 * 8) * 4);
                                  local_500 = (Allocator *)((long)(iVar12 * 4) * 4);
                                  local_598 = (Allocator *)(long)(int)uVar17;
                                  do {
                                    local_5a0 = (ulong)uVar22;
                                    if (0 < iVar12) {
                                      lVar25 = (long)(int)uVar22;
                                      local_5b8 = (Allocator *)
                                                  (long)((iVar11 + (int)local_598) /
                                                        local_560.elempack);
                                      lVar15 = 0;
                                      ppp_Var19 = (_func_int ***)0x0;
                                      do {
                                        local_5b0 = ppp_Var19;
                                        lVar16 = (long)local_460.data + lVar15;
                                        lVar18 = -0x40;
                                        do {
                                          auVar51 = *(undefined1 (*) [16])
                                                     ((long)&local_500->_vptr_Allocator +
                                                     lVar16 + lVar25 * 4);
                                          auVar50 = *(undefined1 (*) [16])
                                                     ((long)&local_588->_vptr_Allocator +
                                                     lVar16 + lVar25 * 4);
                                          auVar55 = vpaddd_avx(auVar51,*(undefined1 (*) [16])
                                                                        (lVar16 + lVar25 * 4));
                                          auVar55 = vpaddd_avx(auVar55,auVar50);
                                          auVar51 = vpsubd_avx(auVar51,auVar50);
                                          auVar51 = vpaddd_avx(auVar51,*(undefined1 (*) [16])
                                                                        ((long)&local_508->
                                                                                _vptr_Allocator +
                                                                        lVar16 + lVar25 * 4));
                                          *(undefined1 (*) [16])((long)local_2c0 + lVar18) = auVar55
                                          ;
                                          *(undefined1 (*) [16])(local_280 + lVar18) = auVar51;
                                          lVar16 = lVar16 + (long)(int)uVar37 * 4;
                                          lVar18 = lVar18 + 0x10;
                                        } while (lVar18 != 0);
                                        iVar21 = iVar30 + (int)local_5b0;
                                        iVar33 = iVar21 % iVar29;
                                        uVar17 = (iVar21 / iVar29) * 2;
                                        pauVar31 = (undefined1 (*) [16])
                                                   ((long)(_func_int ***)local_560.data +
                                                   (long)(iVar33 * 2 * local_560.elempack) * 4 +
                                                   (long)local_560.w * local_560.elemsize *
                                                   (long)(int)uVar17 +
                                                   local_560.cstep * (long)local_5b8 *
                                                   local_560.elemsize);
                                        iVar33 = iVar33 * 2 + 1;
                                        pauVar42 = (undefined1 (*) [16])&iStack_2d0;
                                        lVar16 = 0;
                                        do {
                                          if ((int)(uVar17 | (uint)lVar16) < local_560.h) {
                                            auVar51 = vpaddd_avx(pauVar42[-2],pauVar42[-3]);
                                            auVar50 = vpsubd_avx(pauVar42[-2],pauVar42[-1]);
                                            auVar50 = vpaddd_avx(auVar50,*pauVar42);
                                            auVar51 = vpaddd_avx(auVar51,pauVar42[-1]);
                                            auVar55 = vpsrad_avx(auVar51,2);
                                            auVar51 = vpsrad_avx(auVar50,2);
                                            if (local_560.elempack == 1) {
                                              auVar3._8_8_ = 0;
                                              auVar3._0_8_ = pauVar31;
                                              vpscatterdd_avx512vl
                                                        (auVar3 + auVar44 * (undefined1  [16])0x4,
                                                         0xffff,auVar55);
                                              if (iVar33 < local_560.w) {
                                                auVar55._8_8_ = 0;
                                                auVar55._0_8_ = pauVar31;
                                                vpscatterdd_avx512vl
                                                          (auVar55 + ZEXT816(4) +
                                                           auVar44 * (undefined1  [16])0x4,0xffff,
                                                           auVar51);
                                              }
                                            }
                                            else if ((local_560.elempack == 4) &&
                                                    (*pauVar31 = auVar55, iVar33 < local_560.w)) {
                                              pauVar31[1] = auVar51;
                                            }
                                            pauVar31 = (undefined1 (*) [16])
                                                       (*pauVar31 +
                                                       (long)(local_560.elempack * local_560.w) * 4)
                                            ;
                                          }
                                          lVar16 = lVar16 + 1;
                                          pauVar42 = pauVar42 + 4;
                                        } while (lVar16 == 1);
                                        lVar15 = lVar15 + 0x10;
                                        ppp_Var19 = (_func_int ***)((long)local_5b0 + 1);
                                      } while ((_func_int ***)((long)local_5b0 + 1) != local_578);
                                    }
                                    pAVar23 = (Allocator *)((long)&local_598->_vptr_Allocator + 4);
                                    ppp_Var19 = &local_598->_vptr_Allocator;
                                    uVar22 = uVar22 + iVar12 * 0x40;
                                    local_598 = pAVar23;
                                  } while ((long)((long)ppp_Var19 + 7) < (long)local_468);
                                  uVar17 = (uint)pAVar23;
                                }
                                if ((int)(uVar17 | 1) < (int)uVar13) {
                                  local_3c8 = local_460.data;
                                  local_598 = (Allocator *)(long)(iVar12 * 2);
                                  local_580 = (void *)(long)(iVar12 * 4);
                                  local_500 = (Allocator *)(long)(iVar12 * 6);
                                  local_d0 = (Allocator *)local_560.data;
                                  local_588 = (Allocator *)local_560.elemsize;
                                  local_d8 = local_560.cstep * local_560.elemsize;
                                  local_508 = (Allocator *)(local_590 & 0xffffffff);
                                  uVar22 = uVar17 * iVar12 * 0x10;
                                  local_3c0 = CONCAT44(local_3c0._4_4_,iVar12 * 0x20);
                                  local_4f0 = (long)(int)uVar17;
                                  do {
                                    local_5a0 = (ulong)uVar22;
                                    if (0 < iVar12) {
                                      local_578 = (_func_int ***)
                                                  ((long)(_func_int ***)local_560.data +
                                                  (local_308 + local_4f0) *
                                                  local_560.cstep * local_560.elemsize);
                                      ppp_Var19 = (_func_int ***)
                                                  ((long)local_460.data + (long)(int)uVar22 * 4);
                                      pAVar23 = (Allocator *)0x0;
                                      do {
                                        local_5b8 = pAVar23;
                                        local_5b0 = ppp_Var19;
                                        lVar25 = -0x20;
                                        ppp_Var19 = local_5b0;
                                        do {
                                          auVar44._8_8_ = 0;
                                          auVar44._0_8_ = *ppp_Var19;
                                          auVar52._8_8_ = 0;
                                          auVar52._0_8_ =
                                               *(ulong *)((long)ppp_Var19 + (long)local_598 * 4);
                                          auVar44 = vpaddd_avx(auVar52,auVar44);
                                          auVar56._8_8_ = 0;
                                          auVar56._0_8_ =
                                               *(ulong *)((long)ppp_Var19 + (long)local_580 * 4);
                                          auVar44 = vpaddd_avx(auVar44,auVar56);
                                          *(long *)((long)&pAStack_2e0 + lVar25) = auVar44._0_8_;
                                          auVar44 = vpsubd_avx(auVar52,auVar56);
                                          auVar53._8_8_ = 0;
                                          auVar53._0_8_ =
                                               *(ulong *)((long)ppp_Var19 + (long)local_500 * 4);
                                          auVar44 = vpaddd_avx(auVar44,auVar53);
                                          *(long *)((long)local_2c0 + lVar25) = auVar44._0_8_;
                                          ppp_Var19 = (_func_int ***)
                                                      ((long)ppp_Var19 + (long)(iVar12 * 8) * 4);
                                          lVar25 = lVar25 + 8;
                                        } while (lVar25 != 0);
                                        iVar33 = iVar30 + (int)local_5b8;
                                        iVar11 = iVar33 % iVar29;
                                        uVar17 = (iVar33 / iVar29) * 2;
                                        piVar24 = (int *)((long)local_578 +
                                                         (long)(iVar11 * 2) * 4 +
                                                         (long)local_560.w * local_560.elemsize *
                                                         (long)(int)uVar17);
                                        piVar20 = (int *)auStack_2e4;
                                        lVar25 = 0;
                                        do {
                                          if ((int)(uVar17 | (uint)lVar25) < local_560.h) {
                                            iVar33 = piVar20[-5];
                                            iVar21 = piVar20[-4];
                                            iVar27 = piVar20[-3];
                                            iVar34 = piVar20[-6];
                                            iVar4 = piVar20[-2];
                                            iVar5 = piVar20[-1];
                                            iVar6 = *piVar20;
                                            *piVar24 = piVar20[-7] + iVar33 + iVar27 >> 2;
                                            piVar24[local_4e8] = iVar34 + iVar21 + iVar4 >> 2;
                                            if (iVar11 * 2 + 1 < local_560.w) {
                                              piVar24[1] = (iVar33 - iVar27) + iVar5 >> 2;
                                              piVar24[(long)local_4e8 + 1] =
                                                   (iVar21 - iVar4) + iVar6 >> 2;
                                            }
                                            piVar24 = piVar24 + local_560.w;
                                          }
                                          lVar25 = lVar25 + 1;
                                          piVar20 = piVar20 + 8;
                                        } while (lVar25 == 1);
                                        pAVar23 = (Allocator *)
                                                  ((long)&local_5b8->_vptr_Allocator + 1);
                                        ppp_Var19 = local_5b0 + 1;
                                      } while (pAVar23 != local_508);
                                    }
                                    lVar25 = local_4f0 + 2;
                                    lVar15 = local_4f0 + 3;
                                    uVar22 = uVar22 + iVar12 * 0x20;
                                    local_4f0 = lVar25;
                                  } while (lVar15 < (long)local_468);
                                  uVar17 = (uint)lVar25;
                                }
                                if ((int)uVar17 < (int)uVar13) {
                                  local_580 = local_460.data;
                                  local_500 = (Allocator *)local_560.data;
                                  local_5b8 = (Allocator *)local_560.elemsize;
                                  local_588 = (Allocator *)(local_560.cstep * local_560.elemsize);
                                  local_598 = (Allocator *)(long)(int)uVar17;
                                  local_578 = (_func_int ***)(local_590 & 0xffffffff);
                                  uVar17 = uVar17 * iVar12 * 0x10;
                                  do {
                                    local_5a0 = (ulong)uVar17;
                                    if (0 < iVar12) {
                                      piVar24 = (int *)((long)local_460.data + (long)(int)uVar17 * 4
                                                       );
                                      local_5b0 = (_func_int ***)
                                                  ((long)(_func_int ***)local_560.data +
                                                  ((long)&local_598->_vptr_Allocator + local_308) *
                                                  (long)local_588);
                                      lVar25 = 0;
                                      do {
                                        lVar15 = -0x10;
                                        piVar20 = piVar24;
                                        do {
                                          iVar11 = piVar20[iVar12];
                                          iVar33 = piVar20[iVar12 * 2];
                                          *(int *)(local_300 + lVar15 + 0x10) =
                                               *piVar20 + iVar11 + iVar33;
                                          *(int *)((long)&pAStack_2e0 + lVar15) =
                                               (iVar11 - iVar33) + piVar20[iVar12 * 3];
                                          piVar20 = piVar20 + iVar12 * 4;
                                          lVar15 = lVar15 + 4;
                                        } while (lVar15 != 0);
                                        iVar33 = iVar30 + (int)lVar25;
                                        iVar11 = iVar33 % iVar29;
                                        uVar22 = (iVar33 / iVar29) * 2;
                                        piVar20 = (int *)((long)local_5b0 +
                                                         (long)(iVar11 * 2) * 4 +
                                                         (long)local_560.w * local_560.elemsize *
                                                         (long)(int)uVar22);
                                        piVar38 = (int *)(local_300 + 0xc);
                                        lVar15 = 0;
                                        do {
                                          if ((int)(uVar22 | (uint)lVar15) < local_560.h) {
                                            iVar33 = piVar38[-2];
                                            iVar21 = piVar38[-1];
                                            iVar27 = *piVar38;
                                            *piVar20 = piVar38[-3] + iVar33 + iVar21 >> 2;
                                            if (iVar11 * 2 + 1 < local_560.w) {
                                              piVar20[1] = (iVar33 - iVar21) + iVar27 >> 2;
                                            }
                                            piVar20 = piVar20 + local_560.w;
                                          }
                                          lVar15 = lVar15 + 1;
                                          piVar38 = piVar38 + 4;
                                        } while (lVar15 == 1);
                                        lVar25 = lVar25 + 1;
                                        piVar24 = piVar24 + 1;
                                      } while ((_func_int ***)lVar25 != local_578);
                                    }
                                    local_598 = (Allocator *)((long)&local_598->_vptr_Allocator + 1)
                                    ;
                                    uVar17 = uVar17 + uVar37;
                                  } while (local_598 != local_468);
                                }
                                uVar14 = (ulong)(iVar30 + local_5bc);
                                uVar32 = local_490;
                                pCVar36 = local_5a8;
                                uVar39 = local_498;
                              } while ((int)(iVar30 + local_5bc) < (int)local_498);
                            }
                            iVar29 = local_3b4;
                            piVar24 = (int *)CONCAT44(local_460.refcount._4_4_,
                                                      local_460.refcount._0_4_);
                            if (piVar24 != (int *)0x0) {
                              LOCK();
                              *piVar24 = *piVar24 + -1;
                              UNLOCK();
                              if (*piVar24 == 0) {
                                if (local_460.allocator == (Allocator *)0x0) {
                                  if (local_460.data != (void *)0x0) {
                                    free(local_460.data);
                                  }
                                }
                                else {
                                  (*(local_460.allocator)->_vptr_Allocator[3])();
                                }
                              }
                            }
                            local_460.cstep = 0;
                            local_460.data = (void *)0x0;
                            local_460.refcount._0_4_ = 0;
                            local_460.refcount._4_4_ = 0;
                            local_460.elemsize._0_4_ = 0;
                            local_460.elemsize._4_4_ = 0;
                            local_460.elempack = 0;
                            local_460.dims = 0;
                            local_460.w = 0;
                            local_460.h = 0;
                            local_460.d = 0;
                            local_460.c = 0;
                            iVar29 = iVar29 + 1;
                          } while (iVar29 != local_47c);
                          iVar29 = 0;
                          opt_00 = local_510;
                        }
                      }
                      piVar24 = &local_4e0.dims;
                      piVar20 = (int *)CONCAT44(local_4e0.refcount._4_4_,local_4e0.refcount._0_4_);
                      if (piVar20 != (int *)0x0) {
                        LOCK();
                        *piVar20 = *piVar20 + -1;
                        UNLOCK();
                        if (*piVar20 == 0) {
                          if (local_4e0.allocator == (Allocator *)0x0) {
                            if (local_4e0.data != (void *)0x0) {
                              free(local_4e0.data);
                            }
                          }
                          else {
                            (*(local_4e0.allocator)->_vptr_Allocator[3])();
                          }
                        }
                      }
                      local_4e0.cstep = 0;
                      local_4e0.data = (void *)0x0;
                      local_4e0.refcount._0_4_ = 0;
                      local_4e0.refcount._4_4_ = 0;
                      local_4e0.elemsize = 0;
                      local_4e0.elempack = 0;
                    }
                    *(undefined1 (*) [16])piVar24 = (undefined1  [16])0x0;
                    piVar24[4] = 0;
                  }
                }
LAB_0018cb52:
                piVar24 = (int *)CONCAT44(local_410.refcount._4_4_,local_410.refcount._0_4_);
                if (piVar24 != (int *)0x0) {
                  LOCK();
                  *piVar24 = *piVar24 + -1;
                  UNLOCK();
                  if (*piVar24 == 0) {
                    if (local_410.allocator == (Allocator *)0x0) {
                      if (local_410.data != (void *)0x0) {
                        free(local_410.data);
                      }
                    }
                    else {
                      (*(local_410.allocator)->_vptr_Allocator[3])();
                    }
                  }
                }
                local_410.cstep = 0;
                local_410.data = (void *)0x0;
                local_410.refcount._0_4_ = 0;
                local_410.refcount._4_4_ = 0;
                local_410.elemsize = 0;
                local_410.elempack = 0;
                local_410.dims = 0;
                local_410.w = 0;
                local_410.h = 0;
                local_410.d = 0;
                local_410.c = 0;
              }
              else {
                iVar29 = conv3x3s1_winograd23_int8_avxvnni
                                   (&local_3b0,&local_560,&pCVar36->weight_winograd23_data,iVar12,
                                    opt_00);
              }
            }
            else {
              iVar29 = conv3x3s1_winograd23_int8_avx512vnni
                                 (&local_3b0,&local_560,&pCVar36->weight_winograd23_data,iVar12,
                                  opt_00);
            }
          }
        }
        else if (opt_00->use_sgemm_convolution == true) {
          iVar29 = convolution_im2col_gemm_int8
                             (&local_3b0,&local_560,&pCVar36->weight_sgemm_data,iVar11,iVar30,iVar33
                              ,iVar21,iVar27,iVar34,iVar12,opt_00);
        }
        else {
          iVar29 = 0;
          convolution_packed_int8
                    (&local_3b0,&local_560,&pCVar36->weight_data_tm,iVar11,iVar30,iVar33,iVar21,
                     iVar27,iVar34,opt_00);
        }
        if (iVar29 == 0) {
          if (opt_00->use_packing_layout == true) {
            uVar26 = uStack_2c4;
            if (local_4e4 < 0x65) {
              if ((local_560.elempack == 4) && ((local_560.c & 1U) == 0)) {
                local_2c0[0] = 0;
                _local_300 = ZEXT1228((undefined1  [12])0x0);
                _local_300 = ZEXT3260(_local_300);
                _local_300 = (Option)CONCAT460(uVar26,_local_300);
                convert_packing(&local_560,(Mat *)local_300,8,opt_00);
                if ((Allocator *)local_300._8_8_ != (Allocator *)0x0) {
                  LOCK();
                  *(int *)(_func_int ***)local_300._8_8_ =
                       *(int *)(_func_int ***)local_300._8_8_ + 1;
                  UNLOCK();
                }
                piVar24 = (int *)CONCAT44(local_560.refcount._4_4_,local_560.refcount._0_4_);
                if (piVar24 != (int *)0x0) {
                  LOCK();
                  *piVar24 = *piVar24 + -1;
                  UNLOCK();
                  if (*piVar24 == 0) {
                    if (local_560.allocator == (Allocator *)0x0) {
                      if ((Allocator *)local_560.data != (Allocator *)0x0) {
                        free(local_560.data);
                      }
                    }
                    else {
                      (*(local_560.allocator)->_vptr_Allocator[3])();
                    }
                  }
                }
                auVar10 = _auStack_2e4;
                local_560.data = (void *)local_300._0_8_;
                local_560.refcount._0_4_ = local_300._8_4_;
                local_560.refcount._4_4_ = local_300._12_4_;
                local_560.elemsize = (size_t)stack0xfffffffffffffd10;
                local_560.elempack = aiStack_2ec[1];
                local_560.allocator = pAStack_2e0;
                local_560.dims = local_300._40_4_;
                local_560.w = local_300._44_4_;
                local_560.h = local_300._48_4_;
                local_560.d = local_300._52_4_;
                local_560.c = uStack_2cc._4_4_;
                local_560.cstep = local_2c0[0];
                if ((Allocator *)local_300._8_8_ != (Allocator *)0x0) {
                  LOCK();
                  *(int *)(_func_int ***)local_300._8_8_ =
                       *(int *)(_func_int ***)local_300._8_8_ + -1;
                  UNLOCK();
                  if (*(int *)(_func_int ***)local_300._8_8_ == 0) {
                    if (pAStack_2e0 == (Allocator *)0x0) goto joined_r0x0018b41f;
                    (*pAStack_2e0->_vptr_Allocator[3])();
                    auVar10 = _auStack_2e4;
                  }
                }
                goto LAB_0018b51a;
              }
            }
            else {
              if ((local_560.elempack == 4) && ((local_560.c & 0x80000001U) == 1)) {
                local_2c0[0] = 0;
                _local_300 = ZEXT1228((undefined1  [12])0x0);
                _local_300 = ZEXT3260(_local_300);
                _local_300 = (Option)CONCAT460(uVar26,_local_300);
                convert_packing(&local_560,(Mat *)local_300,1,opt_00);
                if ((Allocator *)local_300._8_8_ != (Allocator *)0x0) {
                  LOCK();
                  *(int *)(_func_int ***)local_300._8_8_ =
                       *(int *)(_func_int ***)local_300._8_8_ + 1;
                  UNLOCK();
                }
                piVar24 = (int *)CONCAT44(local_560.refcount._4_4_,local_560.refcount._0_4_);
                if (piVar24 != (int *)0x0) {
                  LOCK();
                  *piVar24 = *piVar24 + -1;
                  UNLOCK();
                  if (*piVar24 == 0) {
                    if (local_560.allocator == (Allocator *)0x0) {
                      if ((Allocator *)local_560.data != (Allocator *)0x0) {
                        free(local_560.data);
                      }
                    }
                    else {
                      (*(local_560.allocator)->_vptr_Allocator[3])();
                    }
                  }
                }
                auVar10 = _auStack_2e4;
                local_560.data = (void *)local_300._0_8_;
                local_560.refcount._0_4_ = local_300._8_4_;
                local_560.refcount._4_4_ = local_300._12_4_;
                local_560.elemsize = (size_t)stack0xfffffffffffffd10;
                local_560.elempack = aiStack_2ec[1];
                local_560.allocator = pAStack_2e0;
                local_560.dims = local_300._40_4_;
                local_560.w = local_300._44_4_;
                local_560.h = local_300._48_4_;
                local_560.d = local_300._52_4_;
                local_560.c = uStack_2cc._4_4_;
                local_560.cstep = local_2c0[0];
                if ((Allocator *)local_300._8_8_ != (Allocator *)0x0) {
                  LOCK();
                  *(int *)(_func_int ***)local_300._8_8_ =
                       *(int *)(_func_int ***)local_300._8_8_ + -1;
                  UNLOCK();
                  if (*(int *)(_func_int ***)local_300._8_8_ == 0) {
                    if (pAStack_2e0 == (Allocator *)0x0) {
                      if ((Allocator *)local_300._0_8_ != (Allocator *)0x0) {
                        free((void *)local_300._0_8_);
                        auVar10 = _auStack_2e4;
                      }
                    }
                    else {
                      (*pAStack_2e0->_vptr_Allocator[3])();
                      auVar10 = _auStack_2e4;
                    }
                  }
                }
                _auStack_2e4 = auVar10;
                auVar10 = _auStack_2e4;
                local_2c0[0] = 0;
                local_300._0_12_ = SUB1612((undefined1  [16])0x0,0);
                _local_300 = ZEXT1228(local_300._0_12_);
                uStack_2c4 = auVar10._32_4_;
                _local_300 = ZEXT4060(_local_300);
              }
              OVar9 = _local_300;
              if ((local_560.elempack == 4) && ((local_560.c & 1U) == 0)) {
                local_2c0[0] = 0;
                _local_300 = ZEXT1228((undefined1  [12])0x0);
                uStack_2c4 = OVar9._60_4_;
                _local_300 = ZEXT3260(_local_300);
                convert_packing(&local_560,(Mat *)local_300,8,opt_00);
                if ((Allocator *)local_300._8_8_ != (Allocator *)0x0) {
                  LOCK();
                  *(int *)(_func_int ***)local_300._8_8_ =
                       *(int *)(_func_int ***)local_300._8_8_ + 1;
                  UNLOCK();
                }
                piVar24 = (int *)CONCAT44(local_560.refcount._4_4_,local_560.refcount._0_4_);
                if (piVar24 != (int *)0x0) {
                  LOCK();
                  *piVar24 = *piVar24 + -1;
                  UNLOCK();
                  if (*piVar24 == 0) {
                    if (local_560.allocator == (Allocator *)0x0) {
                      if ((Allocator *)local_560.data != (Allocator *)0x0) {
                        free(local_560.data);
                      }
                    }
                    else {
                      (*(local_560.allocator)->_vptr_Allocator[3])();
                    }
                  }
                }
                auVar10 = _auStack_2e4;
                local_560.data = (void *)local_300._0_8_;
                local_560.refcount._0_4_ = local_300._8_4_;
                local_560.refcount._4_4_ = local_300._12_4_;
                local_560.elemsize = (size_t)stack0xfffffffffffffd10;
                local_560.elempack = aiStack_2ec[1];
                local_560.allocator = pAStack_2e0;
                local_560.dims = local_300._40_4_;
                local_560.w = local_300._44_4_;
                local_560.h = local_300._48_4_;
                local_560.d = local_300._52_4_;
                local_560.c = uStack_2cc._4_4_;
                local_560.cstep = local_2c0[0];
                if ((Allocator *)local_300._8_8_ != (Allocator *)0x0) {
                  LOCK();
                  *(int *)(_func_int ***)local_300._8_8_ =
                       *(int *)(_func_int ***)local_300._8_8_ + -1;
                  UNLOCK();
                  if (*(int *)(_func_int ***)local_300._8_8_ == 0) {
                    if (pAStack_2e0 == (Allocator *)0x0) {
joined_r0x0018b41f:
                      if ((Allocator *)local_560.data != (Allocator *)0x0) {
                        local_2c0[0] = local_560.cstep;
                        free(local_560.data);
                        auVar10 = _auStack_2e4;
                      }
                    }
                    else {
                      (*pAStack_2e0->_vptr_Allocator[3])();
                      auVar10 = _auStack_2e4;
                    }
                  }
                }
LAB_0018b51a:
                _auStack_2e4 = auVar10;
                auVar10 = _auStack_2e4;
                local_2c0[0] = 0;
                local_300._0_12_ = SUB1612((undefined1  [16])0x0,0);
                _local_300 = ZEXT1228(local_300._0_12_);
                uStack_2c4 = auVar10._32_4_;
                _local_300 = ZEXT4060(_local_300);
              }
            }
          }
          if (local_4e4 < 0x65) {
            dequantize_from_int32
                      (&local_560,local_478,&pCVar36->scale_in_data,
                       &(pCVar36->super_Convolution).bias_data,opt_00);
            pLVar7 = pCVar36->activation;
            iVar29 = 0;
            if (pLVar7 != (Layer *)0x0) {
              (*pLVar7->_vptr_Layer[9])(pLVar7,local_478,opt_00);
            }
          }
          else {
            iVar29 = 0;
            requantize_from_int32_to_int8
                      (&local_560,local_478,&pCVar36->scale_in_data,
                       &(pCVar36->super_Convolution).top_blob_int8_scales,
                       &(pCVar36->super_Convolution).bias_data,
                       (pCVar36->super_Convolution).activation_type,
                       &(pCVar36->super_Convolution).activation_params,opt_00);
          }
        }
      }
      piVar24 = (int *)CONCAT44(local_560.refcount._4_4_,local_560.refcount._0_4_);
      if (piVar24 != (int *)0x0) {
        LOCK();
        *piVar24 = *piVar24 + -1;
        UNLOCK();
        if (*piVar24 == 0) {
          if (local_560.allocator == (Allocator *)0x0) {
            if ((Allocator *)local_560.data != (Allocator *)0x0) {
              free(local_560.data);
            }
          }
          else {
            (*(local_560.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_560.cstep = 0;
      local_560.data = (void *)0x0;
      local_560.refcount._0_4_ = 0;
      local_560.refcount._4_4_ = 0;
      local_560.elemsize = 0;
      local_560.elempack = 0;
      local_560.dims = 0;
      local_560.w = 0;
      local_560.h = 0;
      local_560.d = 0;
      local_560.c = 0;
    }
  }
  piVar24 = (int *)CONCAT44(local_3b0.refcount._4_4_,local_3b0.refcount._0_4_);
  if (piVar24 != (int *)0x0) {
    LOCK();
    *piVar24 = *piVar24 + -1;
    UNLOCK();
    if (*piVar24 == 0) {
      if (local_3b0.allocator == (Allocator *)0x0) {
        if (local_3b0.data != (void *)0x0) {
          free(local_3b0.data);
        }
      }
      else {
        (*(local_3b0.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_3b0.cstep = 0;
  local_3b0.data = (void *)0x0;
  local_3b0.refcount._0_4_ = 0;
  local_3b0.refcount._4_4_ = 0;
  local_3b0.elemsize = 0;
  local_3b0.elempack = 0;
  local_3b0.dims = 0;
  local_3b0.w = 0;
  local_3b0.h = 0;
  local_3b0.d = 0;
  local_3b0.c = 0;
LAB_0018a3de:
  piVar24 = (int *)CONCAT44(local_360._12_4_,local_360._8_4_);
  if (piVar24 != (int *)0x0) {
    LOCK();
    *piVar24 = *piVar24 + -1;
    UNLOCK();
    if (*piVar24 == 0) {
      if ((Allocator *)local_360._32_8_ == (Allocator *)0x0) {
        if ((void *)local_360._0_8_ != (void *)0x0) {
          free((void *)local_360._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_360._32_8_)[3])();
      }
    }
  }
  return iVar29;
}

Assistant:

int Convolution_x86_avx512::forward_int8_x86(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int elembits = bottom_blob.elembits();

    Mat bottom_blob_int8 = bottom_blob;
    if (elembits != 8)
    {
        Option opt_q = opt;
        opt_q.blob_allocator = opt.workspace_allocator;
        quantize_to_int8(bottom_blob, bottom_blob_int8, bottom_blob_int8_scales, opt_q);
        if (bottom_blob_int8.empty())
            return -100;
    }

    //     NCNN_LOGE("Convolution_x86_avx512 input %d x %d  ksize=%d %d  stride=%d %d", w, h, kernel_w, kernel_h, stride_w, stride_h);

    Mat bottom_blob_bordered;
    make_padding(bottom_blob_int8, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    int w = bottom_blob_bordered.w;
    int h = bottom_blob_bordered.h;
    int channels = bottom_blob_bordered.c;
    int elempack = bottom_blob_bordered.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    bool use_int8_requantize = int8_scale_term > 100;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        if (use_int8_requantize)
            out_elempack = num_output % 8 == 0 ? 8 : 1;
        else
        {
#if __AVX512F__
            out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
            out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
            out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
        }
    }
#endif // __SSE2__
    size_t out_elemsize = use_int8_requantize ? 1u * out_elempack : 4u * out_elempack;

    //     NCNN_LOGE("forward_int8_x86 %d %d %d    %d %d", w, h, bottom_blob_bordered.c, elempack, out_elempack);

    top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    const int num_input = channels * elempack;

    int out_elempack_int32 = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        if (use_int8_requantize)
        {
#if __AVX__
            out_elempack_int32 = num_output % 8 == 0 ? 8 : 1;
#else
            out_elempack_int32 = num_output % 4 == 0 ? 4 : 1;
#endif
        }
        else
        {
#if __AVX512F__
            out_elempack_int32 = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
            out_elempack_int32 = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
            out_elempack_int32 = num_output % 4 == 0 ? 4 : 1;
#endif
        }
    }
#endif // __SSE2__

    bool prefer_winograd = (opt.use_winograd23_convolution || opt.use_winograd43_convolution) && (num_input > 8 || num_output > 8);

#if __SSE2__
    if (opt.use_packing_layout)
    {
        if ((opt.use_winograd_convolution && prefer_winograd && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1) || (!opt.use_sgemm_convolution))
        {
            // TODO implement winograd and packed int8 avx pack8 output
            out_elempack_int32 = num_output % 4 == 0 ? 4 : 1;
        }
    }
#endif // __SSE2__

    Mat top_blob_int32;
    top_blob_int32.create(outw, outh, num_output / out_elempack_int32, (size_t)(4u * out_elempack_int32), out_elempack_int32, opt.workspace_allocator);
    if (top_blob_int32.empty())
        return -100;

    int _nT = nT ? nT : opt.num_threads;
    if (nT != 0 && opt.num_threads != nT)
    {
        // force num_threads the same as in create_pipeline
        // so we could use pre-packed A/B from the same tile config
        NCNN_LOGE("opt.num_threads %d changed, convolution gemm will use load-time value %d", opt.num_threads, nT);
    }

    int ret = 0;
    if (opt.use_winograd_convolution && prefer_winograd && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
    {
        if (opt.use_winograd43_convolution && !weight_winograd43_data.empty())
            ret = conv3x3s1_winograd43_int8(bottom_blob_bordered, top_blob_int32, weight_winograd43_data, _nT, opt);
        else
            ret = conv3x3s1_winograd23_int8(bottom_blob_bordered, top_blob_int32, weight_winograd23_data, _nT, opt);
    }
    else if (opt.use_sgemm_convolution)
    {
        ret = convolution_im2col_gemm_int8(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, _nT, opt);
    }
    else
    {
        convolution_packed_int8(bottom_blob_bordered, top_blob_int32, weight_data_tm, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
    }
    if (ret != 0)
        return ret;

#if __SSE2__
    if (opt.use_packing_layout)
    {
        // NCNN_LOGE("top_blob_int32  %d  %d", top_blob_int32.c, top_blob_int32.elempack);
        if (use_int8_requantize)
        {
            // TODO implement winograd and packed int8 pack1 output
            if (top_blob_int32.elempack == 4 && top_blob_int32.c % 2 == 1)
            {
                Mat tmp;
                convert_packing(top_blob_int32, tmp, 1, opt);
                top_blob_int32 = tmp;
            }
            if (top_blob_int32.elempack == 4 && top_blob_int32.c % 2 == 0)
            {
                Mat tmp;
                convert_packing(top_blob_int32, tmp, 8, opt);
                top_blob_int32 = tmp;
            }
        }
        else
        {
#if __AVX__
            // TODO implement winograd and packed int8 avx pack8 output
            if (top_blob_int32.elempack == 4 && top_blob_int32.c % 2 == 0)
            {
                Mat tmp;
                convert_packing(top_blob_int32, tmp, 8, opt);
                top_blob_int32 = tmp;
            }
#endif // __AVX__
        }
    }
#endif

    if (use_int8_requantize)
    {
        requantize_from_int32_to_int8(top_blob_int32, top_blob, scale_in_data, top_blob_int8_scales, bias_data, activation_type, activation_params, opt);
    }
    else
    {
        dequantize_from_int32(top_blob_int32, top_blob, scale_in_data, bias_data, opt);

        if (activation)
        {
            activation->forward_inplace(top_blob, opt);
        }
    }

    return 0;
}